

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

cmServerResponse * __thiscall
cmServerProtocol1::ProcessCache
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmState *this_00;
  _Base_ptr p_Var1;
  pointer pbVar2;
  bool bVar3;
  CacheEntryType type;
  Value *pVVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  char *pcVar6;
  pointer pbVar7;
  _Base_ptr propertyName;
  const_iterator cVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  Value props;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allKeys;
  undefined1 local_1b0 [24];
  Value entry;
  Value result;
  Value list;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  if ((int)this->m_State < 2) {
    std::__cxx11::string::string
              ((string *)&result,"This project was not configured yet.",(allocator *)&list);
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&result);
    std::__cxx11::string::~string((string *)&result);
  }
  else {
    this_00 = ((this->super_cmServerProtocol).m_CMakeInstance._M_t.
               super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
               super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
               super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State;
    Json::Value::Value(&result,objectValue);
    cmState::GetCacheEntryKeys_abi_cxx11_(&allKeys,this_00);
    Json::Value::Value(&list,arrayValue);
    pVVar4 = Json::Value::operator[](&request->Data,&kKEYS_KEY_abi_cxx11_);
    keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cVar8 = Json::Value::begin(pVVar4);
    props.value_.int_ = (LargestInt)cVar8.super_ValueIteratorBase.current_._M_node;
    props._8_1_ = cVar8.super_ValueIteratorBase.isNull_;
    cVar8 = Json::Value::end(pVVar4);
    local_1b0._0_8_ = cVar8.super_ValueIteratorBase.current_._M_node;
    local_1b0[8] = cVar8.super_ValueIteratorBase.isNull_;
    while( true ) {
      bVar3 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)&props,(SelfType *)local_1b0)
      ;
      pbVar2 = keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (!bVar3) break;
      pVVar4 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&props);
      Json::Value::asString_abi_cxx11_((string *)&entry,pVVar4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&keys,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&entry);
      std::__cxx11::string::~string((string *)&entry);
      Json::ValueIteratorBase::increment((ValueIteratorBase *)&props);
    }
    pbVar7 = keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&keys,&allKeys);
    }
    else {
      for (; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1) {
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (allKeys.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           allKeys.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,pbVar7);
        if (_Var5._M_current ==
            allKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&props
                         ,"Key \"",pbVar7);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&entry
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &props,"\" not found in cache.");
          cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&entry);
          std::__cxx11::string::~string((string *)&entry);
          std::__cxx11::string::~string((string *)&props);
          goto LAB_002a12a8;
        }
      }
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    pbVar2 = keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar7 = keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1)
    {
      Json::Value::Value(&entry,objectValue);
      Json::Value::Value(&local_80,pbVar7);
      pVVar4 = Json::Value::operator[](&entry,&kKEY_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar4,&local_80);
      Json::Value::~Value(&local_80);
      type = cmState::GetCacheEntryType(this_00,pbVar7);
      pcVar6 = cmState::CacheEntryTypeToString(type);
      Json::Value::Value(&local_a8,pcVar6);
      pVVar4 = Json::Value::operator[](&entry,&kTYPE_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar4,&local_a8);
      Json::Value::~Value(&local_a8);
      pcVar6 = cmState::GetCacheEntryValue(this_00,pbVar7);
      Json::Value::Value(&local_d0,pcVar6);
      pVVar4 = Json::Value::operator[](&entry,&kVALUE_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar4,&local_d0);
      Json::Value::~Value(&local_d0);
      Json::Value::Value(&props,objectValue);
      cmState::GetCacheEntryPropertyList
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1b0,this_00,pbVar7);
      p_Var1 = (_Base_ptr)CONCAT71(local_1b0._9_7_,local_1b0[8]);
      bVar3 = false;
      for (propertyName = (_Base_ptr)local_1b0._0_8_; propertyName != p_Var1;
          propertyName = propertyName + 1) {
        pcVar6 = cmState::GetCacheEntryProperty(this_00,pbVar7,(string *)propertyName);
        Json::Value::Value(&local_58,pcVar6);
        pVVar4 = Json::Value::operator[](&props,(string *)propertyName);
        Json::Value::operator=(pVVar4,&local_58);
        Json::Value::~Value(&local_58);
        bVar3 = true;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b0);
      if (bVar3) {
        Json::Value::Value(&local_f8,&props);
        pVVar4 = Json::Value::operator[](&entry,&kPROPERTIES_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar4,&local_f8);
        Json::Value::~Value(&local_f8);
      }
      Json::Value::append(&list,&entry);
      Json::Value::~Value(&props);
      Json::Value::~Value(&entry);
    }
    Json::Value::Value(&local_120,&list);
    pVVar4 = Json::Value::operator[](&result,&kCACHE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar4,&local_120);
    Json::Value::~Value(&local_120);
    cmServerRequest::Reply(__return_storage_ptr__,request,&result);
LAB_002a12a8:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&keys);
    Json::Value::~Value(&list);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&allKeys);
    Json::Value::~Value(&result);
  }
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessCache(
  const cmServerRequest& request)
{
  if (this->m_State < STATE_CONFIGURED) {
    return request.ReportError("This project was not configured yet.");
  }

  cmState* state = this->CMakeInstance()->GetState();

  Json::Value result = Json::objectValue;

  std::vector<std::string> allKeys = state->GetCacheEntryKeys();

  Json::Value list = Json::arrayValue;
  std::vector<std::string> keys = toStringList(request.Data[kKEYS_KEY]);
  if (keys.empty()) {
    keys = allKeys;
  } else {
    for (const auto& i : keys) {
      if (std::find(allKeys.begin(), allKeys.end(), i) == allKeys.end()) {
        return request.ReportError("Key \"" + i + "\" not found in cache.");
      }
    }
  }
  std::sort(keys.begin(), keys.end());
  for (const auto& key : keys) {
    Json::Value entry = Json::objectValue;
    entry[kKEY_KEY] = key;
    entry[kTYPE_KEY] =
      cmState::CacheEntryTypeToString(state->GetCacheEntryType(key));
    entry[kVALUE_KEY] = state->GetCacheEntryValue(key);

    Json::Value props = Json::objectValue;
    bool haveProperties = false;
    for (const auto& prop : state->GetCacheEntryPropertyList(key)) {
      haveProperties = true;
      props[prop] = state->GetCacheEntryProperty(key, prop);
    }
    if (haveProperties) {
      entry[kPROPERTIES_KEY] = props;
    }

    list.append(entry);
  }

  result[kCACHE_KEY] = list;
  return request.Reply(result);
}